

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O1

void duckdb::ReadDataFromListSegment
               (ListSegmentFunctions *functions,ListSegment *segment,Vector *result,
               idx_t *total_count)

{
  ulong *puVar1;
  ushort uVar2;
  idx_t iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ListSegment *pLVar4;
  byte bVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  Vector *pVVar9;
  VectorListBuffer *this_00;
  const_reference pvVar10;
  data_ptr_t pdVar11;
  long lVar12;
  element_type *peVar13;
  element_type *to_reserve;
  ulong uVar14;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  ListSegmentFunctions *local_40;
  idx_t local_38;
  
  local_40 = functions;
  FlatVector::VerifyFlatVector(result);
  uVar7 = (ulong)segment->count;
  if (uVar7 != 0) {
    uVar14 = 0;
    do {
      if (*(char *)((long)&segment[1].count + uVar14) == '\x01') {
        iVar3 = *total_count;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var6 = p_Stack_50;
          peVar13 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar13;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar5 = (byte)(iVar3 + uVar14) & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (iVar3 + uVar14 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      uVar14 = uVar14 + 1;
      uVar7 = (ulong)segment->count;
    } while (uVar14 < uVar7);
  }
  pdVar11 = result->data;
  if (*total_count == 0) {
    peVar13 = (element_type *)0x0;
  }
  else {
    lVar12 = *total_count * 0x10;
    peVar13 = (element_type *)
              (*(long *)(pdVar11 + lVar12 + -8) + *(long *)(pdVar11 + lVar12 + -0x10));
  }
  to_reserve = peVar13;
  if (uVar7 != 0) {
    uVar2 = segment->capacity;
    pdVar11 = pdVar11 + 8;
    uVar14 = 0;
    do {
      lVar12 = *(long *)((long)&segment[1].count + uVar14 * 8 + (ulong)uVar2);
      *(long *)(pdVar11 + *total_count * 0x10) = lVar12;
      *(element_type **)(pdVar11 + *total_count * 0x10 + -8) = to_reserve;
      to_reserve = (element_type *)
                   ((long)&(to_reserve->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t + lVar12);
      uVar14 = uVar14 + 1;
      pdVar11 = pdVar11 + 0x10;
    } while (uVar7 != uVar14);
  }
  pVVar9 = ListVector::GetEntryInternal<duckdb::Vector>(result);
  pLVar4 = *(ListSegment **)((long)&segment[1].next + (ulong)segment->capacity * 9);
  this_00 = (VectorListBuffer *)
            shared_ptr<duckdb::VectorBuffer,_true>::operator->(&result->auxiliary);
  VectorListBuffer::Reserve(this_00,(idx_t)to_reserve);
  pvVar10 = vector<duckdb::ListSegmentFunctions,_true>::operator[](&local_40->child_functions,0);
  local_58 = peVar13;
  for (; pLVar4 != (ListSegment *)0x0; pLVar4 = pLVar4->next) {
    (*pvVar10->read_data)(pvVar10,pLVar4,pVVar9,(idx_t *)&local_58);
    local_58 = (element_type *)
               ((long)&(local_58->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
               + (ulong)pLVar4->count);
  }
  ListVector::SetListSize(result,(idx_t)to_reserve);
  return;
}

Assistant:

static void ReadDataFromListSegment(const ListSegmentFunctions &functions, const ListSegment *segment, Vector &result,
                                    idx_t &total_count) {

	auto &aggr_vector_validity = FlatVector::Validity(result);

	// set NULLs
	auto null_mask = GetNullMask(segment);
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			aggr_vector_validity.SetInvalid(total_count + i);
		}
	}

	auto list_vector_data = FlatVector::GetData<list_entry_t>(result);

	// get the starting offset
	idx_t offset = 0;
	if (total_count != 0) {
		offset = list_vector_data[total_count - 1].offset + list_vector_data[total_count - 1].length;
	}
	idx_t starting_offset = offset;

	// set length and offsets
	auto list_length_data = GetListLengthData(segment);
	for (idx_t i = 0; i < segment->count; i++) {
		auto list_length = Load<uint64_t>(const_data_ptr_cast(list_length_data + i));
		list_vector_data[total_count + i].length = list_length;
		list_vector_data[total_count + i].offset = offset;
		offset += list_length;
	}

	auto &child_vector = ListVector::GetEntry(result);
	auto linked_child_list = Load<LinkedList>(const_data_ptr_cast(GetListChildData(segment)));
	ListVector::Reserve(result, offset);

	// recurse into the linked list of child values
	D_ASSERT(functions.child_functions.size() == 1);
	functions.child_functions[0].BuildListVector(linked_child_list, child_vector, starting_offset);
	ListVector::SetListSize(result, offset);
}